

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMultiphysicsCompMesh.cpp
# Opt level: O3

void __thiscall TPZMultiphysicsCompMesh::TPZMultiphysicsCompMesh(TPZMultiphysicsCompMesh *this)

{
  *(undefined ***)&this->super_TPZCompMesh = &PTR__TPZSavable_01925a48;
  TPZCompMesh::TPZCompMesh(&this->super_TPZCompMesh,&PTR_PTR_01925860);
  *(undefined ***)&this->super_TPZCompMesh = &PTR__TPZMultiphysicsCompMesh_01925748;
  TPZVec<int>::TPZVec(&(this->m_active_approx_spaces).super_TPZVec<int>,0);
  (this->m_active_approx_spaces).super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01815498;
  (this->m_active_approx_spaces).super_TPZVec<int>.fStore = (this->m_active_approx_spaces).fExtAlloc
  ;
  (this->m_active_approx_spaces).super_TPZVec<int>.fNElements = 0;
  (this->m_active_approx_spaces).super_TPZVec<int>.fNAlloc = 0;
  TPZVec<TPZCompMesh_*>::TPZVec(&(this->m_mesh_vector).super_TPZVec<TPZCompMesh_*>,0);
  (this->m_mesh_vector).super_TPZVec<TPZCompMesh_*>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01925ab8;
  (this->m_mesh_vector).super_TPZVec<TPZCompMesh_*>.fStore = (this->m_mesh_vector).fExtAlloc;
  (this->m_mesh_vector).super_TPZVec<TPZCompMesh_*>.fNElements = 0;
  (this->m_mesh_vector).super_TPZVec<TPZCompMesh_*>.fNAlloc = 0;
  TPZManVector<int,_5>::Resize(&this->m_active_approx_spaces,0);
  TPZManVector<TPZCompMesh_*,_7>::Resize(&this->m_mesh_vector,0);
  return;
}

Assistant:

TPZMultiphysicsCompMesh::TPZMultiphysicsCompMesh() : TPZCompMesh(){
    
    m_active_approx_spaces.Resize(0);
    m_mesh_vector.Resize(0);
}